

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_426627::BIP324Test::TestBIP324PacketVector
          (BIP324Test *this,uint32_t in_idx,string *in_priv_ours_hex,string *in_ellswift_ours_hex,
          string *in_ellswift_theirs_hex,bool in_initiating,string *in_contents_hex,
          uint32_t in_multiply,string *in_aad_hex,bool in_ignore,string *mid_send_garbage_hex,
          string *mid_recv_garbage_hex,string *out_session_id_hex,string *out_ciphertext_hex,
          string *out_ciphertext_endswith_hex)

{
  byte *pbVar1;
  byte bVar2;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<std::byte> contents_00;
  pointer pbVar3;
  undefined1 uVar4;
  uint32_t uVar5;
  int iVar6;
  uint64_t uVar7;
  ulong uVar8;
  element_type *__dest;
  undefined8 uVar9;
  pointer pbVar10;
  byte *pbVar11;
  uint uVar12;
  uint uVar13;
  size_type __n;
  check_type cVar21;
  string *psVar14;
  iterator pvVar15;
  undefined7 in_register_00000089;
  iterator pvVar16;
  undefined ***pppuVar17;
  bool *ignore;
  FastRandomContext *this_00;
  long lVar18;
  size_t sVar19;
  long in_FS_OFFSET;
  bool bVar20;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  string_view hex_str_03;
  string_view hex_str_04;
  string_view hex_str_05;
  string_view hex_str_06;
  string_view hex_str_07;
  string_view hex_str_08;
  Span<const_std::byte> ellswift;
  Span<const_std::byte> ellswift_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<const_std::byte> contents_01;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  Span<const_std::byte> input_01;
  Span<const_std::byte> input_02;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  Span<const_std::byte> aad;
  Span<const_std::byte> aad_00;
  undefined4 in_stack_00000014;
  undefined7 in_stack_00000021;
  undefined8 *in_stack_00000050;
  bool dec_ignore;
  vector<std::byte,_std::allocator<std::byte>_> decrypted;
  vector<std::byte,_std::allocator<std::byte>_> dec_aad;
  bool dec_ignore_1;
  vector<std::byte,_std::allocator<std::byte>_> to_decrypt;
  vector<std::byte,_std::allocator<std::byte>_> ciphertext;
  vector<std::byte,_std::allocator<std::byte>_> contents;
  vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  dummies;
  vector<std::byte,_std::allocator<std::byte>_> out_ciphertext_endswith;
  vector<std::byte,_std::allocator<std::byte>_> out_ciphertext;
  vector<std::byte,_std::allocator<std::byte>_> out_session_id;
  vector<std::byte,_std::allocator<std::byte>_> mid_recv_garbage;
  vector<std::byte,_std::allocator<std::byte>_> mid_send_garbage;
  vector<std::byte,_std::allocator<std::byte>_> in_aad;
  vector<std::byte,_std::allocator<std::byte>_> in_contents;
  vector<std::byte,_std::allocator<std::byte>_> in_ellswift_theirs;
  vector<std::byte,_std::allocator<std::byte>_> in_ellswift_ours;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_priv_ours;
  BIP324Cipher dec_cipher;
  BIP324Cipher cipher;
  EllSwiftPubKey ellswift_theirs;
  EllSwiftPubKey ellswift_ours;
  check_type cVar22;
  char *local_be0;
  char *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  undefined1 local_b70 [16];
  assertion_result local_b60;
  undefined1 *local_b48;
  undefined1 *local_b40;
  char *local_b38;
  char *local_b30;
  byte *local_b28;
  check_type cStack_b20;
  bool local_b11;
  vector<std::byte,_std::allocator<std::byte>_> local_b10;
  vector<std::byte,_std::allocator<std::byte>_> local_af8;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  undefined1 *local_a88;
  undefined1 *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  assertion_result local_9c8;
  vector<std::byte,_std::allocator<std::byte>_> *local_9b0;
  assertion_result local_9a8;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  byte *local_8e0;
  check_type cStack_8d8;
  vector<std::byte,_std::allocator<std::byte>_> local_8d0;
  byte *local_8b8;
  long lStack_8b0;
  long local_8a8;
  byte *local_8a0;
  size_t sStack_898;
  vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  local_890;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  undefined1 local_758 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_750;
  vector<std::byte,_std::allocator<std::byte>_> local_748;
  vector<std::byte,_std::allocator<std::byte>_> local_730;
  vector<std::byte,_std::allocator<std::byte>_> local_718;
  vector<std::byte,_std::allocator<std::byte>_> local_700;
  vector<std::byte,_std::allocator<std::byte>_> local_6e8;
  vector<std::byte,_std::allocator<std::byte>_> local_6d0;
  vector<std::byte,_std::allocator<std::byte>_> local_6b8;
  vector<std::byte,_std::allocator<std::byte>_> local_6a0;
  vector<std::byte,_std::allocator<std::byte>_> local_688;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_670;
  undefined1 local_658 [136];
  readonly_property<bool> local_5d0;
  ChaCha20 local_5c8;
  bool local_540;
  ChaCha20 local_538;
  bool local_4b0;
  ChaCha20 local_4a8;
  bool local_420;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_410;
  byte abStack_408 [64];
  byte local_3c8 [32];
  byte local_3a8 [16];
  byte local_398 [16];
  undefined1 local_388 [280];
  bool local_270;
  ChaCha20 local_268;
  bool local_1e0;
  ChaCha20 local_1d8;
  bool local_150;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_140;
  byte abStack_138 [64];
  byte local_f8 [32];
  byte local_d8 [16];
  byte local_c8 [16];
  EllSwiftPubKey local_b8;
  EllSwiftPubKey local_78;
  long local_38;
  
  pvVar16 = (iterator)CONCAT71(in_register_00000089,in_initiating);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (char *)in_priv_ours_hex;
  hex_str._M_len = (size_t)in_ellswift_ours_hex;
  psVar14 = in_ellswift_theirs_hex;
  pvVar15 = pvVar16;
  ParseHex<unsigned_char>(&local_670,hex_str);
  hex_str_00._M_str = (in_ellswift_theirs_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = in_ellswift_theirs_hex->_M_string_length;
  ParseHex<std::byte>(&local_688,hex_str_00);
  hex_str_01._M_str = *(char **)pvVar16;
  hex_str_01._M_len = *(size_t *)(pvVar16 + 8);
  ParseHex<std::byte>(&local_6a0,hex_str_01);
  hex_str_02._M_str = *(char **)CONCAT44(in_stack_00000014,in_multiply);
  hex_str_02._M_len = ((undefined8 *)CONCAT44(in_stack_00000014,in_multiply))[1];
  ParseHex<std::byte>(&local_6b8,hex_str_02);
  hex_str_03._M_str = *(char **)CONCAT71(in_stack_00000021,in_ignore);
  hex_str_03._M_len = ((undefined8 *)CONCAT71(in_stack_00000021,in_ignore))[1];
  ParseHex<std::byte>(&local_6d0,hex_str_03);
  hex_str_04._M_str = (mid_recv_garbage_hex->_M_dataplus)._M_p;
  hex_str_04._M_len = mid_recv_garbage_hex->_M_string_length;
  ParseHex<std::byte>(&local_6e8,hex_str_04);
  hex_str_05._M_str = (out_session_id_hex->_M_dataplus)._M_p;
  hex_str_05._M_len = out_session_id_hex->_M_string_length;
  ParseHex<std::byte>(&local_700,hex_str_05);
  hex_str_06._M_str = (out_ciphertext_hex->_M_dataplus)._M_p;
  hex_str_06._M_len = out_ciphertext_hex->_M_string_length;
  ParseHex<std::byte>(&local_718,hex_str_06);
  hex_str_07._M_str = (out_ciphertext_endswith_hex->_M_dataplus)._M_p;
  hex_str_07._M_len = out_ciphertext_endswith_hex->_M_string_length;
  ParseHex<std::byte>(&local_730,hex_str_07);
  hex_str_08._M_str = (char *)*in_stack_00000050;
  hex_str_08._M_len = in_stack_00000050[1];
  ParseHex<std::byte>(&local_748,hex_str_08);
  local_758[0] = false;
  local_750._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        )(_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  CKey::
  Set<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((CKey *)local_758,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_670.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_670.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,true);
  ellswift.m_size =
       (long)local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  ellswift.m_data =
       local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  EllSwiftPubKey::EllSwiftPubKey(&local_78,ellswift);
  ellswift_00.m_size =
       (long)local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  ellswift_00.m_data =
       local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  EllSwiftPubKey::EllSwiftPubKey(&local_b8,ellswift_00);
  BIP324Cipher::BIP324Cipher((BIP324Cipher *)local_388,(CKey *)local_758,&local_78);
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3d;
  file.m_begin = (iterator)&local_768;
  msg.m_end = pvVar15;
  msg.m_begin = (iterator)psVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_778,msg);
  local_9c8._0_8_ = CONCAT71(local_9c8._1_7_,local_388[0x88]) ^ 1;
  local_9c8.m_message.px = (element_type *)0x0;
  local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe40180;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe40187;
  local_658[8] = false;
  local_658._0_8_ = &PTR__lazy_ostream_01389048;
  local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_780 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_658._24_8_ = &local_890;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar22,(size_t)&local_788,0x3d);
  boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3e;
  file_00.m_begin = (iterator)&local_798;
  msg_00.m_end = pvVar16;
  msg_00.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7a8,
             msg_00);
  lVar18 = 0;
  do {
    aad.m_size = abStack_138 + lVar18;
    bVar2 = local_78.m_pubkey._M_elems[lVar18];
    if (*aad.m_size != bVar2) break;
    bVar20 = lVar18 != 0x3f;
    lVar18 = lVar18 + 1;
  } while (bVar20);
  local_9c8.m_message.px = (element_type *)0x0;
  local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe40319;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe4033f;
  local_658[8] = false;
  local_658._0_8_ = &PTR__lazy_ostream_01389048;
  local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7b0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_658._24_8_ = &local_890;
  local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(*aad.m_size == bVar2);
  boost::test_tools::tt_detail::report_assertion
            (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar22,(size_t)&local_7b8,0x3e);
  boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
  BIP324Cipher::Initialize((BIP324Cipher *)local_388,&local_b8,in_contents_hex._0_1_,false);
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x40;
  file_01.m_begin = (iterator)&local_7c8;
  msg_01.m_end = pvVar16;
  msg_01.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7d8,
             msg_01);
  local_9c8.m_message.px = (element_type *)0x0;
  local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe40181;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe40187;
  local_658[8] = false;
  local_658._0_8_ = &PTR__lazy_ostream_01389048;
  local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7e0 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_658._24_8_ = &local_890;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar22,(size_t)&local_7e8,0x40);
  boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
  local_7f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x43;
  file_02.m_begin = (iterator)&local_7f8;
  msg_02.m_end = pvVar16;
  msg_02.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_808,
             msg_02);
  if ((long)local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start == 0x20) {
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    if (local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      aad.m_size = local_f8;
      pbVar10 = local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (*pbVar10 != *aad.m_size) goto LAB_002cc548;
        pbVar10 = pbVar10 + 1;
        aad.m_size = aad.m_size + 1;
      } while (pbVar10 !=
               local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  else {
LAB_002cc548:
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_9c8.m_message.px = (element_type *)0x0;
  local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe40188;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe401c1;
  local_658[8] = false;
  local_658._0_8_ = &PTR__lazy_ostream_01389048;
  local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_810 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_658._24_8_ = &local_890;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar22,(size_t)&local_818,0x43);
  boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
  local_828 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x44;
  file_03.m_begin = (iterator)&local_828;
  msg_03.m_end = pvVar16;
  msg_03.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_838,
             msg_03);
  if ((long)local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    if (local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      aad.m_size = local_d8;
      pbVar10 = local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (*pbVar10 != *aad.m_size) goto LAB_002cc65b;
        pbVar10 = pbVar10 + 1;
        aad.m_size = aad.m_size + 1;
      } while (pbVar10 !=
               local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  else {
LAB_002cc65b:
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_9c8.m_message.px = (element_type *)0x0;
  local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe401c2;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe40209;
  local_658[8] = false;
  local_658._0_8_ = &PTR__lazy_ostream_01389048;
  local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_848 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_840 = "";
  pvVar15 = (iterator)0x1;
  pvVar16 = (iterator)0x0;
  local_658._24_8_ = &local_890;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar22,(size_t)&local_848,0x44);
  boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
  local_858 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x45;
  file_04.m_begin = (iterator)&local_858;
  msg_04.m_end = pvVar16;
  msg_04.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_868,
             msg_04);
  if ((long)local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    if (local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      aad.m_size = local_c8;
      pbVar10 = local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (*pbVar10 != *aad.m_size) goto LAB_002cc76e;
        pbVar10 = pbVar10 + 1;
        aad.m_size = aad.m_size + 1;
      } while (pbVar10 !=
               local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  else {
LAB_002cc76e:
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_9c8.m_message.px = (element_type *)0x0;
  local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe4020a;
  local_890.
  super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe40254;
  local_658[8] = false;
  local_658._0_8_ = &PTR__lazy_ostream_01389048;
  local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
  ;
  local_870 = "";
  local_658._24_8_ = &local_890;
  boost::test_tools::tt_detail::report_assertion
            (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar22,(size_t)&local_878,0x45);
  boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
  std::
  vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
  ::vector(&local_890,(ulong)in_idx,(allocator_type *)local_658);
  if (in_idx != 0) {
    lVar18 = 0;
    do {
      std::vector<std::byte,_std::allocator<std::byte>_>::resize
                ((vector<std::byte,_std::allocator<std::byte>_> *)
                 ((long)&((local_890.
                           super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar18),0x14);
      local_8a0 = *(byte **)((long)&((local_890.
                                      super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar18);
      sStack_898 = *(long *)((long)&((local_890.
                                      super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>).
                                    _M_impl.super__Vector_impl_data._M_finish + lVar18) -
                   (long)local_8a0;
      output.m_size = sStack_898;
      output.m_data = local_8a0;
      BIP324Cipher::Encrypt
                ((BIP324Cipher *)local_388,(Span<const_std::byte>)ZEXT816(0),
                 (Span<const_std::byte>)ZEXT816(0),true,output);
      lVar18 = lVar18 + 0x18;
    } while ((ulong)in_idx * 0x18 != lVar18);
  }
  local_8b8 = (byte *)0x0;
  lStack_8b0 = 0;
  local_8a8 = 0;
  if ((int)in_aad_hex == 0) {
    __n = 0x14;
  }
  else {
    do {
      std::vector<std::byte,std::allocator<std::byte>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>>
                ((vector<std::byte,std::allocator<std::byte>> *)&local_8b8,lStack_8b0,
                 local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      in_aad_hex._0_4_ = (int)in_aad_hex + -1;
    } while ((int)in_aad_hex != 0);
    __n = (lStack_8b0 - (long)local_8b8) + 0x14;
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&local_8d0,__n,(allocator_type *)local_658);
  contents_01.m_size = lStack_8b0 - (long)local_8b8;
  aad.m_size = local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
  local_8e0 = local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  _cVar21 = (check_type)
            ((long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start);
  pvVar15 = (iterator)((ulong)mid_send_garbage_hex & 0xff);
  output_00.m_size = (size_t)_cVar21;
  output_00.m_data =
       local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  contents_01.m_data = local_8b8;
  aad.m_data = local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
  _cStack_8d8 = _cVar21;
  BIP324Cipher::Encrypt
            ((BIP324Cipher *)local_388,contents_01,aad,mid_send_garbage_hex._0_1_,output_00);
  if (local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_920 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_918 = "";
    local_930 = &boost::unit_test::basic_cstring<char_const>::null;
    local_928 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x5d;
    file_06.m_begin = (iterator)&local_920;
    msg_06.m_end = pvVar15;
    msg_06.m_begin = (iterator)aad.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_930,
               msg_06);
    local_9c8.m_message.px = (element_type *)0x0;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_9a8._0_8_ = "ciphertext.size() >= out_ciphertext_endswith.size()";
    local_9a8.m_message.px = (element_type *)0xe402a5;
    local_658[8] = false;
    local_658._0_8_ = &PTR__lazy_ostream_01389048;
    local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_940 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_938 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    local_658._24_8_ = &local_9a8;
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ulong)((long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start) <=
         (ulong)((long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start));
    boost::test_tools::tt_detail::report_assertion
              (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar21,(size_t)&local_940,0x5d);
    boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
    local_950 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_948 = "";
    local_960 = &boost::unit_test::basic_cstring<char_const>::null;
    local_958 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x5e;
    file_07.m_begin = (iterator)&local_950;
    msg_07.m_end = pvVar16;
    msg_07.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_960,
               msg_07);
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    if ((long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start -
        (long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish != 0) {
      aad.m_size = local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish +
                   ((long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start -
                   (long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish);
      pbVar10 = local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (*pbVar10 != *aad.m_size) {
          local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
          break;
        }
        pbVar10 = pbVar10 + 1;
        aad.m_size = aad.m_size + 1;
      } while (pbVar10 !=
               local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_9c8.m_message.px = (element_type *)0x0;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_9a8._0_8_ =
         "std::ranges::equal(out_ciphertext_endswith, Span{ciphertext}.last(out_ciphertext_endswith.size()))"
    ;
    local_9a8.m_message.px = (element_type *)0xe40308;
    local_658[8] = false;
    local_658._0_8_ = &PTR__lazy_ostream_01389048;
    local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_970 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_968 = "";
    pvVar15 = (iterator)0x1;
    pppuVar17 = (undefined ***)0x0;
    local_658._24_8_ = &local_9a8;
    boost::test_tools::tt_detail::report_assertion
              (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar21,(size_t)&local_970,0x5e);
  }
  else {
    local_8f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_8e8 = "";
    local_900 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x5b;
    file_05.m_begin = (iterator)&local_8f0;
    msg_05.m_end = pvVar15;
    msg_05.m_begin = (iterator)aad.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_900,
               msg_05);
    if ((long)local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
      uVar4 = 1;
      aad.m_size = local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
      for (aad_00.m_size =
                local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
          aad_00.m_size !=
          local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish; aad_00.m_size = aad_00.m_size + 1) {
        if (*aad_00.m_size != *aad.m_size) {
          uVar4 = 0;
          break;
        }
        aad.m_size = aad.m_size + 1;
      }
    }
    else {
      uVar4 = 0;
    }
    local_9c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)uVar4;
    local_9c8.m_message.px = (element_type *)0x0;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_658._24_8_ = &local_9a8;
    local_9a8._0_8_ = "out_ciphertext == ciphertext";
    local_9a8.m_message.px = (element_type *)0xe40271;
    local_658[8] = false;
    local_658._0_8_ = &PTR__lazy_ostream_01389048;
    local_658._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_910 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_908 = "";
    pvVar15 = (iterator)0x1;
    pppuVar17 = (undefined ***)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9c8,(lazy_ostream *)local_658,1,0,WARN,_cVar21,(size_t)&local_910,0x5b);
  }
  boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  iVar6 = 0;
  do {
    BIP324Cipher::BIP324Cipher((BIP324Cipher *)local_658,(CKey *)local_758,&local_78);
    local_980 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_978 = "";
    local_990 = &boost::unit_test::basic_cstring<char_const>::null;
    local_988 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x6c;
    file_08.m_begin = (iterator)&local_980;
    msg_08.m_end = (iterator)pppuVar17;
    msg_08.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_990,
               msg_08);
    local_9a8._0_8_ = CONCAT71(local_9a8._1_7_,local_5d0.super_class_property<bool>.value) ^ 1;
    local_9a8.m_message.px = (element_type *)0x0;
    local_9a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xe40309;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xe40314;
    local_9c8.m_message.px = (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
    local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &local_af8;
    local_9d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_9d0 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9a8,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_9d8,0x6c);
    boost::detail::shared_count::~shared_count(&local_9a8.m_message.pn);
    local_9e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_9e0 = "";
    local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x6d;
    file_09.m_begin = (iterator)&local_9e8;
    msg_09.m_end = pvVar16;
    msg_09.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_9f8,
               msg_09);
    lVar18 = 0;
    do {
      aad.m_size = abStack_408 + lVar18;
      bVar2 = local_78.m_pubkey._M_elems[lVar18];
      if (*aad.m_size != bVar2) break;
      bVar20 = lVar18 != 0x3f;
      lVar18 = lVar18 + 1;
    } while (bVar20);
    local_9a8.m_message.px = (element_type *)0x0;
    local_9a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xe40315;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xe4033f;
    local_9c8.m_message.px = (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
    local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &local_af8;
    local_a08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a00 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    local_9a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(*aad.m_size == bVar2);
    boost::test_tools::tt_detail::report_assertion
              (&local_9a8,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_a08,0x6d);
    boost::detail::shared_count::~shared_count(&local_9a8.m_message.pn);
    BIP324Cipher::Initialize
              ((BIP324Cipher *)local_658,&local_b8,(bool)(iVar6 == 1 ^ in_contents_hex._0_1_),true);
    local_a18 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a10 = "";
    local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x6f;
    file_10.m_begin = (iterator)&local_a18;
    msg_10.m_end = pvVar16;
    msg_10.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_a28,
               msg_10);
    local_9a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)local_5d0.super_class_property<bool>.value;
    local_9a8.m_message.px = (element_type *)0x0;
    local_9a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xe4030a;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xe40314;
    local_9c8.m_message.px = (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
    local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &local_af8;
    local_a38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a30 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9a8,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_a38,0x6f);
    boost::detail::shared_count::~shared_count(&local_9a8.m_message.pn);
    local_a48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a40 = "";
    local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x72;
    file_11.m_begin = (iterator)&local_a48;
    msg_11.m_end = pvVar16;
    msg_11.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_a58,
               msg_11);
    bVar20 = true;
    if ((long)local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start == 0x20) {
      if (local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar20 = false;
      }
      else {
        aad.m_size = local_3c8;
        aad_00.m_size =
             local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        do {
          pbVar11 = aad_00.m_size + 1;
          bVar20 = *aad_00.m_size != *aad.m_size;
          if (bVar20) break;
          aad.m_size = aad.m_size + 1;
          aad_00.m_size = pbVar11;
        } while (pbVar11 !=
                 local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    local_9a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar6 != 1 ^ bVar20);
    local_9a8.m_message.px = (element_type *)0x0;
    local_9a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xe40340;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xe4038d;
    local_9c8.m_message.px = (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
    local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &local_af8;
    local_a68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a60 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9a8,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_a68,0x72);
    boost::detail::shared_count::~shared_count(&local_9a8.m_message.pn);
    local_a78 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a70 = "";
    local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x73;
    file_12.m_begin = (iterator)&local_a78;
    msg_12.m_end = pvVar16;
    msg_12.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_a88,
               msg_12);
    bVar20 = true;
    if ((long)local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      if (local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar20 = false;
      }
      else {
        aad.m_size = local_3a8;
        aad_00.m_size =
             local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        do {
          pbVar11 = aad_00.m_size + 1;
          bVar20 = *aad_00.m_size != *aad.m_size;
          if (bVar20) break;
          aad.m_size = aad.m_size + 1;
          aad_00.m_size = pbVar11;
        } while (pbVar11 !=
                 local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    local_9a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar6 != 1 ^ bVar20);
    local_9a8.m_message.px = (element_type *)0x0;
    local_9a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xe4038e;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xe403e9;
    local_9c8.m_message.px = (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
    local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &local_af8;
    local_a98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_a90 = "";
    pvVar15 = (iterator)0x1;
    pvVar16 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9a8,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_a98,0x73);
    boost::detail::shared_count::~shared_count(&local_9a8.m_message.pn);
    local_aa8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_aa0 = "";
    local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x74;
    file_13.m_begin = (iterator)&local_aa8;
    msg_13.m_end = pvVar16;
    msg_13.m_begin = pvVar15;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_ab8,
               msg_13);
    bVar20 = true;
    if ((long)local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      if (local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar20 = false;
      }
      else {
        aad.m_size = local_398;
        aad_00.m_size =
             local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        do {
          pbVar11 = aad_00.m_size + 1;
          bVar20 = *aad_00.m_size != *aad.m_size;
          if (bVar20) break;
          aad.m_size = aad.m_size + 1;
          aad_00.m_size = pbVar11;
        } while (pbVar11 !=
                 local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
    }
    local_9a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(iVar6 != 1 ^ bVar20);
    local_9a8.m_message.px = (element_type *)0x0;
    local_9a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xe403ea;
    local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xe40448;
    local_9c8.m_message.px = (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
    local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
    local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_9b0 = &local_af8;
    local_ac8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
    ;
    local_ac0 = "";
    pvVar15 = (iterator)0x1;
    pppuVar17 = (undefined ***)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9a8,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_ac8,0x74);
    boost::detail::shared_count::~shared_count(&local_9a8.m_message.pn);
    if (iVar6 != 0xc || in_idx != 0) {
      uVar12 = 0;
      if (iVar6 == 0xc) {
        do {
          uVar7 = RandomMixin<FastRandomContext>::randbits
                            (&this_00->super_RandomMixin<FastRandomContext>,4);
        } while (0xf < uVar7);
        uVar12 = 1 << ((byte)uVar7 & 0x1f);
      }
      if (uVar12 != in_idx) {
        uVar13 = 0;
        do {
          uVar8 = 0;
          if (uVar13 < in_idx) {
            uVar8 = (ulong)uVar13;
          }
          local_9c8._0_8_ = local_9c8._0_8_ & 0xffffffffffffff00;
          input.m_size = 3;
          input.m_data = local_890.
                         super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8].
                         super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_start;
          BIP324Cipher::DecryptLength((BIP324Cipher *)local_658,input);
          pbVar10 = local_890.
                    super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].
                    super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
          input_00.m_data = pbVar10 + 3;
          input_00.m_size =
               local_890.
               super__Vector_base<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].
               super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish + (-3 - (long)pbVar10);
          local_ad8 = 0;
          uStack_ad0 = 0;
          _cVar21 = CHECK_PRED;
          pvVar15 = (iterator)0x0;
          pppuVar17 = (undefined ***)&local_9c8;
          BIP324Cipher::Decrypt
                    ((BIP324Cipher *)local_658,input_00,(Span<const_std::byte>)ZEXT816(0),
                     (bool *)&local_9c8,(Span<std::byte>)ZEXT816(0));
          uVar13 = uVar13 + 1;
        } while ((uVar12 ^ in_idx) + (uint)((uVar12 ^ in_idx) == 0) != uVar13);
      }
      local_9a8._0_8_ = (element_type *)0x0;
      local_9a8.m_message.px = (element_type *)0x0;
      local_9a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      uVar8 = (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar8 != 0) {
        if (-1 < (long)uVar8) {
          __dest = (element_type *)operator_new(uVar8);
          sVar19 = (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_start;
          goto LAB_002cd581;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_alloc();
LAB_002cdf08:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar9 = std::__throw_bad_alloc();
            boost::detail::shared_count::~shared_count(&local_9c8.m_message.pn);
            if (local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_8d0.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_8d0.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_8b8 != (byte *)0x0) {
              operator_delete(local_8b8,local_8a8 - (long)local_8b8);
            }
            std::
            vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
            ::~vector(&local_890);
            if (local_140._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
              SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                        ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_140,
                         local_140._M_head_impl);
            }
            local_140._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
            if (local_150 == true) {
              local_150 = false;
              ChaCha20::~ChaCha20(&local_1d8);
            }
            if (local_1e0 == true) {
              local_1e0 = false;
              ChaCha20::~ChaCha20(&local_268);
            }
            if (local_270 == true) {
              local_270 = false;
              ChaCha20::~ChaCha20((ChaCha20 *)(local_388 + 0x90));
            }
            if (local_388[0x88] == true) {
              local_388[0x88] = false;
              ChaCha20::~ChaCha20((ChaCha20 *)local_388);
            }
            if (local_750._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 )0x0) {
              SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                        ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_750,
                         (array<unsigned_char,_32UL> *)
                         local_750._M_t.
                         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                         _M_head_impl);
            }
            if (local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_748.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_748.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_730.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_730.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_718.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_718.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_700.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_700.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_6e8.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_6e8.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_6d0.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_6d0.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_6b8.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_6b8.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_6a0.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_6a0.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_688.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_688.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_670.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (uchar *)0x0) {
              operator_delete(local_670.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_670.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_670.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar9);
            }
          }
        }
        goto LAB_002ce40d;
      }
      __dest = (element_type *)0x0;
      sVar19 = 0;
LAB_002cd581:
      local_9a8.m_message.pn.pi_ = (sp_counted_base *)(uVar8 + (long)__dest);
      local_9a8._0_8_ = __dest;
      if (local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_9a8.m_message.px = __dest;
        memmove(__dest,local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar19);
      }
      local_9a8.m_message.px =
           (element_type *)
           ((long)&(__dest->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream + sVar19);
      if (iVar6 - 2U < 8) {
        uVar8 = sVar19 - 1;
        if (uVar8 == 0) {
          uVar12 = 0x40;
        }
        else {
          lVar18 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar18 == 0; lVar18 = lVar18 + -1) {
            }
          }
          uVar12 = (uint)lVar18 ^ 0x3f;
        }
        do {
          uVar7 = RandomMixin<FastRandomContext>::randbits
                            (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar12);
        } while (uVar8 < uVar7);
        pbVar1 = (byte *)((long)&(((wrapped_stream *)local_9a8._0_8_)->
                                 super_basic_ostream<char,_std::char_traits<char>_>).
                                 _vptr_basic_ostream + uVar7);
        *pbVar1 = *pbVar1 ^ (byte)(1 << ((byte)(iVar6 - 2U) & 0x1f));
        __dest = (element_type *)local_9a8._0_8_;
      }
      input_01.m_size = 3;
      input_01.m_data = (byte *)__dest;
      uVar5 = BIP324Cipher::DecryptLength((BIP324Cipher *)local_658,input_01);
      std::vector<std::byte,_std::allocator<std::byte>_>::resize
                ((vector<std::byte,_std::allocator<std::byte>_> *)&local_9a8,(ulong)(uVar5 + 0x14));
      local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (byte *)0x0;
      local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (byte *)0x0;
      local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (byte *)0x0;
      uVar8 = (long)local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar8 == 0) {
        aad.m_size = (byte *)0x0;
        sVar19 = 0;
      }
      else {
        if ((long)uVar8 < 0) goto LAB_002cdf08;
        aad.m_size = (byte *)operator_new(uVar8);
        sVar19 = (long)local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      pbVar3 = local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pbVar10 = local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = aad.m_size + uVar8;
      local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = aad.m_size;
      if (local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = aad.m_size;
        memmove(aad.m_size,
                local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start,sVar19);
      }
      local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = aad.m_size + sVar19;
      if (iVar6 == 0xb) {
        local_9c8._0_8_ = local_9c8._0_8_ & 0xffffffffffffff00;
        std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
                  (&local_af8,(byte *)&local_9c8);
LAB_002cd798:
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  (&local_b10,(ulong)uVar5,(allocator_type *)&local_9c8);
        local_b11 = false;
        input_02.m_data =
             (byte *)((long)&(((wrapped_stream *)local_9a8._0_8_)->
                             super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream
                     + 3);
        input_02.m_size = (byte *)((long)local_9a8.m_message.px + (-3 - local_9a8._0_8_));
        aad_00.m_size =
             local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_b28 = local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
        _cVar21 = (check_type)
                  ((long)local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start);
        ignore = &local_b11;
        contents_00.m_size = (size_t)_cVar21;
        contents_00.m_data =
             local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        aad_00.m_data =
             local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        _cStack_b20 = _cVar21;
        bVar20 = BIP324Cipher::Decrypt((BIP324Cipher *)local_658,input_02,aad_00,ignore,contents_00)
        ;
        local_b38 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
        ;
        local_b30 = "";
        local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
        local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
        file_14.m_end = (iterator)0x99;
        file_14.m_begin = (iterator)&local_b38;
        msg_14.m_end = ignore;
        msg_14.m_begin = (iterator)aad_00.m_size;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_b48
                   ,msg_14);
        local_b60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)((iVar6 != 0) != bVar20);
        local_b60.m_message.px = (element_type *)0x0;
        local_b60.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_b70._0_8_ = "dec_ok == !error";
        local_b70._8_8_ = "";
        local_9c8.m_message.px =
             (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
        local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
        local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_9b0 = (vector<std::byte,_std::allocator<std::byte>_> *)local_b70;
        local_b80 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
        ;
        local_b78 = "";
        pvVar15 = (iterator)0x1;
        pppuVar17 = (undefined ***)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_b60,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_b80,0x99);
        boost::detail::shared_count::~shared_count(&local_b60.m_message.pn);
        if (bVar20) {
          local_b90 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_b88 = "";
          local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
          file_15.m_end = (iterator)0x9b;
          file_15.m_begin = (iterator)&local_b90;
          msg_15.m_end = (iterator)pppuVar17;
          msg_15.m_begin = pvVar15;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                     (size_t)&local_ba0,msg_15);
          if ((long)local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start == lStack_8b0 - (long)local_8b8) {
            local_b60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(class_property<bool>)0x1;
            aad_00.m_size = local_8b8;
            for (aad.m_size = local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                aad.m_size !=
                local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish; aad.m_size = aad.m_size + 1) {
              if (*aad.m_size != *aad_00.m_size) {
                local_b60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(class_property<bool>)0x0;
                break;
              }
              aad_00.m_size = aad_00.m_size + 1;
            }
          }
          else {
            local_b60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(class_property<bool>)0x0;
          }
          local_b60.m_message.px = (element_type *)0x0;
          local_b60.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b70._0_8_ = "decrypted == contents";
          local_b70._8_8_ = "";
          local_9c8.m_message.px =
               (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
          local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
          local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_9b0 = (vector<std::byte,_std::allocator<std::byte>_> *)local_b70;
          local_bb0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_ba8 = "";
          pvVar15 = (iterator)0x1;
          pvVar16 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_b60,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_bb0,0x9b)
          ;
          boost::detail::shared_count::~shared_count(&local_b60.m_message.pn);
          local_bc0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_bb8 = "";
          local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_16.m_end = (iterator)0x9c;
          file_16.m_begin = (iterator)&local_bc0;
          msg_16.m_end = pvVar16;
          msg_16.m_begin = pvVar15;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                     (size_t)&local_bd0,msg_16);
          local_b60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(local_b11 == mid_send_garbage_hex._0_1_);
          local_b60.m_message.px = (element_type *)0x0;
          local_b60.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_b70._0_8_ = "dec_ignore == in_ignore";
          local_b70._8_8_ = "";
          local_9c8.m_message.px =
               (element_type *)((ulong)local_9c8.m_message.px & 0xffffffffffffff00);
          local_9c8._0_8_ = &PTR__lazy_ostream_01389048;
          local_9c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_9b0 = (vector<std::byte,_std::allocator<std::byte>_> *)local_b70;
          local_be0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bip324_tests.cpp"
          ;
          local_bd8 = "";
          pvVar15 = (iterator)0x1;
          pppuVar17 = (undefined ***)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_b60,(lazy_ostream *)&local_9c8,1,0,WARN,_cVar21,(size_t)&local_be0,0x9c)
          ;
          boost::detail::shared_count::~shared_count(&local_b60.m_message.pn);
        }
        aad.m_size = local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start;
        if (local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start != (byte *)0x0) {
          operator_delete(local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b10.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          aad.m_size = local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
        }
      }
      else {
        if (iVar6 != 10) goto LAB_002cd798;
        if (pbVar3 != pbVar10) {
          do {
            uVar7 = RandomMixin<FastRandomContext>::randbits
                              (&this_00->super_RandomMixin<FastRandomContext>,3);
          } while (7 < uVar7);
          aad.m_size = local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                       ~(ulong)local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                               _M_impl.super__Vector_impl_data._M_start;
          if (aad.m_size == (byte *)0x0) {
            uVar12 = 0x40;
          }
          else {
            lVar18 = 0x3f;
            if (aad.m_size != (byte *)0x0) {
              for (; (ulong)aad.m_size >> lVar18 == 0; lVar18 = lVar18 + -1) {
              }
            }
            uVar12 = (uint)lVar18 ^ 0x3f;
          }
          do {
            aad_00.m_size =
                 (byte *)RandomMixin<FastRandomContext>::randbits
                                   (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar12);
          } while (aad.m_size < aad_00.m_size);
          local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start[(long)aad_00.m_size] =
               local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start[(long)aad_00.m_size] ^
               (byte)(1 << ((byte)uVar7 & 0x1f));
          goto LAB_002cd798;
        }
      }
      if (aad.m_size != (byte *)0x0) {
        operator_delete(aad.m_size,
                        (long)local_af8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - (long)aad.m_size);
      }
      if ((element_type *)local_9a8._0_8_ != (element_type *)0x0) {
        operator_delete((void *)local_9a8._0_8_,(long)local_9a8.m_message.pn.pi_ - local_9a8._0_8_);
      }
    }
    if (local_410._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_410,
                 local_410._M_head_impl);
    }
    local_410._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
    if (local_420 == true) {
      local_420 = false;
      ChaCha20::~ChaCha20(&local_4a8);
    }
    if (local_4b0 == true) {
      local_4b0 = false;
      ChaCha20::~ChaCha20(&local_538);
    }
    if (local_540 == true) {
      local_540 = false;
      ChaCha20::~ChaCha20(&local_5c8);
    }
    if (local_5d0.super_class_property<bool>.value == true) {
      local_5d0.super_class_property<bool>.value = (class_property<bool>)false;
      ChaCha20::~ChaCha20((ChaCha20 *)local_658);
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 0xd) {
      if (local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_8d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_8b8 != (byte *)0x0) {
        operator_delete(local_8b8,local_8a8 - (long)local_8b8);
      }
      std::
      vector<std::vector<std::byte,_std::allocator<std::byte>_>,_std::allocator<std::vector<std::byte,_std::allocator<std::byte>_>_>_>
      ::~vector(&local_890);
      if (local_140._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_140,
                   local_140._M_head_impl);
      }
      local_140._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
      if (local_150 == true) {
        local_150 = false;
        ChaCha20::~ChaCha20(&local_1d8);
      }
      if (local_1e0 == true) {
        local_1e0 = false;
        ChaCha20::~ChaCha20(&local_268);
      }
      if (local_270 == true) {
        local_270 = false;
        ChaCha20::~ChaCha20((ChaCha20 *)(local_388 + 0x90));
      }
      if (local_388[0x88] == true) {
        local_388[0x88] = false;
        ChaCha20::~ChaCha20((ChaCha20 *)local_388);
      }
      if (local_750._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_750,
                   (array<unsigned_char,_32UL> *)
                   local_750._M_t.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
      }
      if (local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_748.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_730.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_718.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_700.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6e8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6d0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6b8.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6a0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_688.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_670.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_670.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_670.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_670.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
LAB_002ce40d:
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void TestBIP324PacketVector(
    uint32_t in_idx,
    const std::string& in_priv_ours_hex,
    const std::string& in_ellswift_ours_hex,
    const std::string& in_ellswift_theirs_hex,
    bool in_initiating,
    const std::string& in_contents_hex,
    uint32_t in_multiply,
    const std::string& in_aad_hex,
    bool in_ignore,
    const std::string& mid_send_garbage_hex,
    const std::string& mid_recv_garbage_hex,
    const std::string& out_session_id_hex,
    const std::string& out_ciphertext_hex,
    const std::string& out_ciphertext_endswith_hex)
{
    // Convert input from hex to char/byte vectors/arrays.
    const auto in_priv_ours = ParseHex(in_priv_ours_hex);
    const auto in_ellswift_ours = ParseHex<std::byte>(in_ellswift_ours_hex);
    const auto in_ellswift_theirs = ParseHex<std::byte>(in_ellswift_theirs_hex);
    const auto in_contents = ParseHex<std::byte>(in_contents_hex);
    const auto in_aad = ParseHex<std::byte>(in_aad_hex);
    const auto mid_send_garbage = ParseHex<std::byte>(mid_send_garbage_hex);
    const auto mid_recv_garbage = ParseHex<std::byte>(mid_recv_garbage_hex);
    const auto out_session_id = ParseHex<std::byte>(out_session_id_hex);
    const auto out_ciphertext = ParseHex<std::byte>(out_ciphertext_hex);
    const auto out_ciphertext_endswith = ParseHex<std::byte>(out_ciphertext_endswith_hex);

    // Load keys
    CKey key;
    key.Set(in_priv_ours.begin(), in_priv_ours.end(), true);
    EllSwiftPubKey ellswift_ours(in_ellswift_ours);
    EllSwiftPubKey ellswift_theirs(in_ellswift_theirs);

    // Instantiate encryption BIP324 cipher.
    BIP324Cipher cipher(key, ellswift_ours);
    BOOST_CHECK(!cipher);
    BOOST_CHECK(cipher.GetOurPubKey() == ellswift_ours);
    cipher.Initialize(ellswift_theirs, in_initiating);
    BOOST_CHECK(cipher);

    // Compare session variables.
    BOOST_CHECK(std::ranges::equal(out_session_id, cipher.GetSessionID()));
    BOOST_CHECK(std::ranges::equal(mid_send_garbage, cipher.GetSendGarbageTerminator()));
    BOOST_CHECK(std::ranges::equal(mid_recv_garbage, cipher.GetReceiveGarbageTerminator()));

    // Vector of encrypted empty messages, encrypted in order to seek to the right position.
    std::vector<std::vector<std::byte>> dummies(in_idx);

    // Seek to the numbered packet.
    for (uint32_t i = 0; i < in_idx; ++i) {
        dummies[i].resize(cipher.EXPANSION);
        cipher.Encrypt({}, {}, true, dummies[i]);
    }

    // Construct contents and encrypt it.
    std::vector<std::byte> contents;
    for (uint32_t i = 0; i < in_multiply; ++i) {
        contents.insert(contents.end(), in_contents.begin(), in_contents.end());
    }
    std::vector<std::byte> ciphertext(contents.size() + cipher.EXPANSION);
    cipher.Encrypt(contents, in_aad, in_ignore, ciphertext);

    // Verify ciphertext. Note that the test vectors specify either out_ciphertext (for short
    // messages) or out_ciphertext_endswith (for long messages), so only check the relevant one.
    if (!out_ciphertext.empty()) {
        BOOST_CHECK(out_ciphertext == ciphertext);
    } else {
        BOOST_CHECK(ciphertext.size() >= out_ciphertext_endswith.size());
        BOOST_CHECK(std::ranges::equal(out_ciphertext_endswith, Span{ciphertext}.last(out_ciphertext_endswith.size())));
    }

    for (unsigned error = 0; error <= 12; ++error) {
        // error selects a type of error introduced:
        // - error=0: no errors, decryption should be successful
        // - error=1: wrong side
        // - error=2..9: bit error in ciphertext
        // - error=10: bit error in aad
        // - error=11: extra 0x00 at end of aad
        // - error=12: message index wrong

        // Instantiate self-decrypting BIP324 cipher.
        BIP324Cipher dec_cipher(key, ellswift_ours);
        BOOST_CHECK(!dec_cipher);
        BOOST_CHECK(dec_cipher.GetOurPubKey() == ellswift_ours);
        dec_cipher.Initialize(ellswift_theirs, (error == 1) ^ in_initiating, /*self_decrypt=*/true);
        BOOST_CHECK(dec_cipher);

        // Compare session variables.
        BOOST_CHECK(std::ranges::equal(out_session_id, dec_cipher.GetSessionID()) == (error != 1));
        BOOST_CHECK(std::ranges::equal(mid_send_garbage, dec_cipher.GetSendGarbageTerminator()) == (error != 1));
        BOOST_CHECK(std::ranges::equal(mid_recv_garbage, dec_cipher.GetReceiveGarbageTerminator()) == (error != 1));

        // Seek to the numbered packet.
        if (in_idx == 0 && error == 12) continue;
        uint32_t dec_idx = in_idx ^ (error == 12 ? (1U << m_rng.randrange(16)) : 0);
        for (uint32_t i = 0; i < dec_idx; ++i) {
            unsigned use_idx = i < in_idx ? i : 0;
            bool dec_ignore{false};
            dec_cipher.DecryptLength(Span{dummies[use_idx]}.first(cipher.LENGTH_LEN));
            dec_cipher.Decrypt(Span{dummies[use_idx]}.subspan(cipher.LENGTH_LEN), {}, dec_ignore, {});
        }

        // Construct copied (and possibly damaged) copy of ciphertext.
        // Decrypt length
        auto to_decrypt = ciphertext;
        if (error >= 2 && error <= 9) {
            to_decrypt[m_rng.randrange(to_decrypt.size())] ^= std::byte(1U << (error - 2));
        }

        // Decrypt length and resize ciphertext to accommodate.
        uint32_t dec_len = dec_cipher.DecryptLength(MakeByteSpan(to_decrypt).first(cipher.LENGTH_LEN));
        to_decrypt.resize(dec_len + cipher.EXPANSION);

        // Construct copied (and possibly damaged) copy of aad.
        auto dec_aad = in_aad;
        if (error == 10) {
            if (in_aad.size() == 0) continue;
            dec_aad[m_rng.randrange(dec_aad.size())] ^= std::byte(1U << m_rng.randrange(8));
        }
        if (error == 11) dec_aad.push_back({});

        // Decrypt contents.
        std::vector<std::byte> decrypted(dec_len);
        bool dec_ignore{false};
        bool dec_ok = dec_cipher.Decrypt(Span{to_decrypt}.subspan(cipher.LENGTH_LEN), dec_aad, dec_ignore, decrypted);

        // Verify result.
        BOOST_CHECK(dec_ok == !error);
        if (dec_ok) {
            BOOST_CHECK(decrypted == contents);
            BOOST_CHECK(dec_ignore == in_ignore);
        }
    }
}